

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDtdPtr xmlSAXParseDTD(xmlSAXHandlerPtr sax,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlParserCtxtPtr ctxt_00;
  xmlChar *pxVar1;
  xmlChar *systemIdCanonic;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlDtdPtr ret;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlSAXHandlerPtr sax_local;
  
  systemIdCanonic = (xmlChar *)0x0;
  if ((ExternalID == (xmlChar *)0x0) && (SystemID == (xmlChar *)0x0)) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      xmlCtxtSetOptions(ctxt_00,4);
      pxVar1 = xmlCanonicPath(SystemID);
      if ((SystemID == (xmlChar *)0x0) || (pxVar1 != (xmlChar *)0x0)) {
        if ((ctxt_00->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt_00->sax->resolveEntity != (resolveEntitySAXFunc)0x0)) {
          systemIdCanonic =
               (xmlChar *)(*ctxt_00->sax->resolveEntity)(ctxt_00->userData,ExternalID,pxVar1);
        }
        if (systemIdCanonic == (xmlChar *)0x0) {
          xmlFreeParserCtxt(ctxt_00);
          if (pxVar1 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar1);
          }
          sax_local = (xmlSAXHandlerPtr)0x0;
        }
        else {
          if (*(long *)(systemIdCanonic + 8) == 0) {
            *(xmlChar **)(systemIdCanonic + 8) = pxVar1;
          }
          else {
            (*xmlFree)(pxVar1);
          }
          sax_local = (xmlSAXHandlerPtr)
                      xmlCtxtParseDtd(ctxt_00,(xmlParserInputPtr)systemIdCanonic,ExternalID,SystemID
                                     );
          xmlFreeParserCtxt(ctxt_00);
        }
      }
      else {
        xmlFreeParserCtxt(ctxt_00);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
    }
  }
  return (xmlDtdPtr)sax_local;
}

Assistant:

xmlDtdPtr
xmlSAXParseDTD(xmlSAXHandlerPtr sax, const xmlChar *ExternalID,
                          const xmlChar *SystemID) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input = NULL;
    xmlChar* systemIdCanonic;

    if ((ExternalID == NULL) && (SystemID == NULL)) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
	return(NULL);
    }
    xmlCtxtSetOptions(ctxt, XML_PARSE_DTDLOAD);

    /*
     * Canonicalise the system ID
     */
    systemIdCanonic = xmlCanonicPath(SystemID);
    if ((SystemID != NULL) && (systemIdCanonic == NULL)) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    /*
     * Ask the Entity resolver to load the damn thing
     */

    if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                 systemIdCanonic);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }

    if (input->filename == NULL)
	input->filename = (char *) systemIdCanonic;
    else
	xmlFree(systemIdCanonic);

    ret = xmlCtxtParseDtd(ctxt, input, ExternalID, SystemID);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}